

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_device.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  EGLint EVar2;
  EGLBoolean EVar3;
  uint uVar4;
  undefined1 *puVar5;
  EGLDisplay pvVar6;
  EGLSurface pvVar7;
  EGLContext pvVar8;
  GLubyte *pGVar9;
  FILE *__stream;
  char *pcVar10;
  EGLDisplay pvVar11;
  size_t sStack_1a0;
  int minor;
  int major;
  EGLint num_devices;
  EGLint local_188 [8];
  EGLint egl_config_attribs [13];
  EGLDeviceEXT egl_devices [32];
  
  egl_config_attribs[8] = 0x3033;
  egl_config_attribs[9] = 1;
  egl_config_attribs[10] = 0x3040;
  egl_config_attribs[0xb] = 8;
  egl_config_attribs[4] = 0x3022;
  egl_config_attribs[5] = 8;
  egl_config_attribs[6] = 0x3025;
  egl_config_attribs[7] = 8;
  egl_config_attribs[0] = 0x3024;
  egl_config_attribs[1] = 8;
  egl_config_attribs[2] = 0x3023;
  egl_config_attribs[3] = 8;
  egl_config_attribs[0xc] = 0x3038;
  local_188[0] = 0x3057;
  local_188[1] = 0x100;
  local_188[2] = 0x3056;
  local_188[3] = 0x100;
  local_188[4] = 0x3038;
  puVar5 = (undefined1 *)operator_new(0x38);
  *puVar5 = 0;
  *(undefined8 *)(puVar5 + 4) = 0;
  iVar1 = gladLoaderLoadEGL((EGLDisplay)0x0);
  if (iVar1 == 0) {
    pcVar10 = "failed to EGL with glad.\n";
LAB_00123c49:
    sStack_1a0 = 0x19;
  }
  else {
    num_devices = 0;
    EVar2 = (*glad_eglGetError)();
    EVar3 = (*glad_eglQueryDevicesEXT)(0x20,egl_devices,&num_devices);
    if ((EVar3 == 0) || (EVar2 != 0x3000)) {
      puts("eglQueryDevicesEXT Failed.");
      *(undefined8 *)(puVar5 + 0x30) = 0;
    }
    iVar1 = atoi(argv[1]);
    *(int *)(puVar5 + 0xc) = iVar1;
    pvVar6 = (*glad_eglGetPlatformDisplayEXT)(0x313f,egl_devices[iVar1],(EGLint *)0x0);
    EVar2 = (*glad_eglGetError)();
    pvVar11 = (EGLDisplay)0x0;
    if ((EVar2 == 0x3000) && (pvVar6 != (EGLDisplay)0x0)) {
      EVar3 = (*glad_eglInitialize)(pvVar6,&major,&minor);
      EVar2 = (*glad_eglGetError)();
      pvVar11 = (EGLDisplay)0x0;
      if ((EVar2 == 0x3000) && (pvVar11 = (EGLDisplay)0x0, EVar3 == 1)) {
        *(EGLDisplay *)(puVar5 + 0x30) = pvVar6;
        pvVar11 = pvVar6;
      }
    }
    EVar3 = (*glad_eglInitialize)(pvVar11,(EGLint *)0x0,(EGLint *)0x0);
    if (EVar3 == 0) {
      pcVar10 = "Unable to initialize EGL\n";
      goto LAB_00123c49;
    }
    pvVar11 = *(EGLDisplay *)(puVar5 + 0x30);
    iVar1 = gladLoaderLoadEGL(pvVar11);
    if (iVar1 == 0) {
      pcVar10 = "Unable to reload EGL.\n";
      sStack_1a0 = 0x16;
    }
    else {
      printf("Loaded EGL %d.%d after reload.\n",(long)iVar1 / 10000 & 0xffffffff,
             (long)iVar1 % 10000 & 0xffffffff);
      EVar3 = (*glad_eglBindAPI)(0x30a2);
      *(EGLBoolean *)(puVar5 + 0x10) = EVar3;
      if (EVar3 != 0) {
        EVar3 = (*glad_eglChooseConfig)
                          (pvVar11,egl_config_attribs,(EGLConfig *)(puVar5 + 0x18),1,
                           (EGLint *)(puVar5 + 0x14));
        *(EGLBoolean *)(puVar5 + 0x10) = EVar3;
        __stream = _stderr;
        if (EVar3 == 0) {
          uVar4 = (*glad_eglGetError)();
          pcVar10 = "Failed to choose config (eglError: %d)\n";
        }
        else {
          uVar4 = *(uint *)(puVar5 + 0x14);
          if (uVar4 == 1) {
            pvVar7 = (*glad_eglCreatePbufferSurface)
                               (*(EGLDisplay *)(puVar5 + 0x30),*(EGLConfig *)(puVar5 + 0x18),
                                local_188);
            *(EGLSurface *)(puVar5 + 0x20) = pvVar7;
            __stream = _stderr;
            if (pvVar7 == (EGLSurface)0x0) {
              uVar4 = (*glad_eglGetError)();
              pcVar10 = "Unable to create EGL surface (eglError: %d)\n";
            }
            else {
              pvVar8 = (*glad_eglCreateContext)
                                 (*(EGLDisplay *)(puVar5 + 0x30),*(EGLConfig *)(puVar5 + 0x18),
                                  (EGLContext)0x0,(EGLint *)0x0);
              *(EGLContext *)(puVar5 + 0x28) = pvVar8;
              __stream = _stderr;
              if (pvVar8 == (EGLContext)0x0) {
                uVar4 = (*glad_eglGetError)();
                pcVar10 = "Unable to create EGL context (eglError: %d)\n";
              }
              else {
                EVar3 = (*glad_eglMakeCurrent)
                                  (*(EGLDisplay *)(puVar5 + 0x30),*(EGLSurface *)(puVar5 + 0x20),
                                   *(EGLSurface *)(puVar5 + 0x20),pvVar8);
                *(EGLBoolean *)(puVar5 + 0x10) = EVar3;
                __stream = _stderr;
                if (EVar3 != 0) {
                  iVar1 = gladLoadGL((GLADloadfunc)glad_eglGetProcAddress);
                  if (iVar1 != 0) {
                    pGVar9 = (*glad_glGetString)(0x1f00);
                    printf("GL_VENDOR=%s\n",pGVar9);
                    pGVar9 = (*glad_glGetString)(0x1f01);
                    printf("GL_RENDERER=%s\n",pGVar9);
                    pGVar9 = (*glad_glGetString)(0x1f02);
                    printf("GL_VERSION=%s\n",pGVar9);
                    pGVar9 = (*glad_glGetString)(0x8b8c);
                    printf("GL_SHADING_LANGUAGE_VERSION=%s\n",pGVar9);
                    return 0;
                  }
                  pcVar10 = "failed to load GL with glad.\n";
                  sStack_1a0 = 0x1d;
                  goto LAB_00123d0e;
                }
                uVar4 = (*glad_eglGetError)();
                pcVar10 = "Failed to make context current (eglError: %d)\n";
              }
            }
          }
          else {
            pcVar10 = "Didn\'t get exactly one config, but %d\n";
          }
        }
        fprintf(__stream,pcVar10,(ulong)uVar4);
        goto LAB_00123d17;
      }
      pcVar10 = "Failed to bind OpenGL API.\n";
      sStack_1a0 = 0x1b;
    }
  }
LAB_00123d0e:
  fwrite(pcVar10,sStack_1a0,1,_stderr);
LAB_00123d17:
  exit(1);
}

Assistant:

int main(int argc, char ** argv){


    int m_windowWidth;
    int m_windowHeight;
    int m_renderDevice;
    
    EGLBoolean success;
    EGLint num_configs;
    EGLConfig egl_config;
    EGLSurface egl_surface;
    EGLContext egl_context;
    EGLDisplay egl_display;
    
    m_windowWidth = 256;
    m_windowHeight = 256;
    m_renderDevice = -1;

    EGLint egl_config_attribs[] = {EGL_RED_SIZE,
        8,
        EGL_GREEN_SIZE,
        8,
        EGL_BLUE_SIZE,
        8,
        EGL_DEPTH_SIZE,
        8,
        EGL_SURFACE_TYPE,
        EGL_PBUFFER_BIT,
        EGL_RENDERABLE_TYPE,
        EGL_OPENGL_BIT,
        EGL_NONE};
    
    EGLint egl_pbuffer_attribs[] = {
        EGL_WIDTH, m_windowWidth, EGL_HEIGHT, m_windowHeight,
        EGL_NONE,
    };
    
    EGLInternalData2* m_data = new EGLInternalData2();

    // Load EGL functions
    int egl_version = gladLoaderLoadEGL(NULL);
    if(!egl_version) {
        fprintf(stderr, "failed to EGL with glad.\n");
        exit(EXIT_FAILURE);

    };

    // Query EGL Devices
    const int max_devices = 32;
    EGLDeviceEXT egl_devices[max_devices];
    EGLint num_devices = 0;
    EGLint egl_error = eglGetError();
    if (!eglQueryDevicesEXT(max_devices, egl_devices, &num_devices) ||
        egl_error != EGL_SUCCESS) {
        printf("eglQueryDevicesEXT Failed.\n");
        m_data->egl_display = EGL_NO_DISPLAY;
    }

    //printf("number of devices found %d\n", num_devices);

    
    m_data->m_renderDevice = atoi(argv[1]);

        // Set display
        EGLDisplay display = eglGetPlatformDisplayEXT(EGL_PLATFORM_DEVICE_EXT,
                                                      egl_devices[m_data->m_renderDevice], NULL);
        if (eglGetError() == EGL_SUCCESS && display != EGL_NO_DISPLAY) {
            int major, minor;
            EGLBoolean initialized = eglInitialize(display, &major, &minor);
            if (eglGetError() == EGL_SUCCESS && initialized == EGL_TRUE) {
                m_data->egl_display = display;
            }
        }

    if (!eglInitialize(m_data->egl_display, NULL, NULL)) {
        fprintf(stderr, "Unable to initialize EGL\n");
        exit(EXIT_FAILURE);
    }

    egl_version = gladLoaderLoadEGL(m_data->egl_display);
    if (!egl_version) {
        fprintf(stderr, "Unable to reload EGL.\n");
        exit(EXIT_FAILURE);
    }
    printf("Loaded EGL %d.%d after reload.\n", GLAD_VERSION_MAJOR(egl_version),
           GLAD_VERSION_MINOR(egl_version));


    m_data->success = eglBindAPI(EGL_OPENGL_API);
    if (!m_data->success) {
        // TODO: Properly handle this error (requires change to default window
        // API to change return on all window types to bool).
        fprintf(stderr, "Failed to bind OpenGL API.\n");
        exit(EXIT_FAILURE);
    }

    m_data->success =
    eglChooseConfig(m_data->egl_display, egl_config_attribs,
                    &m_data->egl_config, 1, &m_data->num_configs);
    if (!m_data->success) {
        // TODO: Properly handle this error (requires change to default window
        // API to change return on all window types to bool).
        fprintf(stderr, "Failed to choose config (eglError: %d)\n", eglGetError());
        exit(EXIT_FAILURE);
    }
    if (m_data->num_configs != 1) {
        fprintf(stderr, "Didn't get exactly one config, but %d\n", m_data->num_configs);
        exit(EXIT_FAILURE);
    }

    m_data->egl_surface = eglCreatePbufferSurface(
                                                  m_data->egl_display, m_data->egl_config, egl_pbuffer_attribs);
    if (m_data->egl_surface == EGL_NO_SURFACE) {
        fprintf(stderr, "Unable to create EGL surface (eglError: %d)\n", eglGetError());
        exit(EXIT_FAILURE);
    }


    m_data->egl_context = eglCreateContext(
                                           m_data->egl_display, m_data->egl_config, EGL_NO_CONTEXT, NULL);
    if (!m_data->egl_context) {
        fprintf(stderr, "Unable to create EGL context (eglError: %d)\n",eglGetError());
        exit(EXIT_FAILURE);
    }

    m_data->success =
        eglMakeCurrent(m_data->egl_display, m_data->egl_surface, m_data->egl_surface,
                   m_data->egl_context);
    if (!m_data->success) {
        fprintf(stderr, "Failed to make context current (eglError: %d)\n", eglGetError());
        exit(EXIT_FAILURE);
    }

    if (!gladLoadGL(eglGetProcAddress)) {
        fprintf(stderr, "failed to load GL with glad.\n");
        exit(EXIT_FAILURE);
    }

    const GLubyte* ven = glGetString(GL_VENDOR);
    printf("GL_VENDOR=%s\n", ven);

    const GLubyte* ren = glGetString(GL_RENDERER);
    printf("GL_RENDERER=%s\n", ren);
    const GLubyte* ver = glGetString(GL_VERSION);
    printf("GL_VERSION=%s\n", ver);
    const GLubyte* sl = glGetString(GL_SHADING_LANGUAGE_VERSION);
    printf("GL_SHADING_LANGUAGE_VERSION=%s\n", sl);

    return 0;
}